

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_16x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  uint uVar2;
  longlong *plVar3;
  longlong lVar4;
  int8_t *piVar5;
  int32_t *piVar6;
  __m128i *palVar7;
  undefined7 in_register_00000009;
  __m128i *palVar8;
  ulong uVar9;
  long lVar10;
  int8_t (*paiVar11) [5];
  undefined8 in_R10;
  int flipud;
  __m128i *in_00;
  undefined8 local_458;
  undefined4 local_450;
  int local_44c;
  int32_t *local_448;
  code *local_440;
  __m128i out [32];
  __m128i in [32];
  
  piVar5 = av1_fwd_txfm_shift_ls[8];
  uVar2 = (uint)CONCAT71(in_register_00000009,tx_type);
  paiVar11 = av1_fwd_cos_bit_col;
  local_450 = (undefined4)CONCAT71((int7)((ulong)in_R10 >> 8),1);
  flipud = 0;
  if (uVar2 < 0x10) {
    if ((0x4110U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x80a0U >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar2 != 6) goto LAB_0039458a;
        flipud = 1;
      }
      else {
        flipud = 0;
      }
      local_450 = 0;
    }
    else {
      flipud = 1;
    }
  }
LAB_0039458a:
  pcVar1 = *(code **)((long)col_highbd_txfm8x8_arr + (ulong)(uVar2 * 8));
  local_440 = *(code **)((long)row_highbd_txfm8x16_arr + (ulong)(uVar2 * 8));
  local_458._4_4_ = 0xd;
  in_00 = in;
  local_44c = stride;
  local_448 = coeff;
  for (lVar10 = 0; piVar6 = local_448, lVar10 != 0x200; lVar10 = lVar10 + 0x100) {
    paiVar11 = (int8_t (*) [5])0x0;
    load_buffer_8x8(input,in_00,local_44c,flipud,0,(int)*piVar5);
    (*pcVar1)(in_00,in_00,local_458._4_4_,2);
    col_txfm_8x8_rounding(in_00,-(int)piVar5[1]);
    transpose_8x8(in_00,(__m128i *)((long)out[0] + lVar10));
    input = input + 8;
  }
  if ((char)local_450 == '\0') {
    palVar8 = in + 0x1e;
    plVar3 = &local_458;
    for (uVar9 = 0; uVar9 < 0x20; uVar9 = uVar9 + 2) {
      lVar4 = plVar3[5];
      (*palVar8)[0] = plVar3[4];
      (*palVar8)[1] = lVar4;
      palVar8 = palVar8 + -2;
      plVar3 = plVar3 + 4;
    }
    palVar7 = in + 0x1f;
    palVar8 = out + 1;
    for (uVar9 = 1; uVar9 < 0x20; uVar9 = uVar9 + 2) {
      lVar4 = (*palVar8)[1];
      (*palVar7)[0] = (*palVar8)[0];
      (*palVar7)[1] = lVar4;
      palVar7 = palVar7 + -2;
      palVar8 = palVar8 + 2;
    }
  }
  else {
    in_00 = out;
  }
  (*local_440)(in_00,out,local_458._4_4_,2);
  for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x100) {
    av1_round_shift_rect_array_32_sse4_1
              ((__m128i *)((long)out[0] + lVar10),in,0x10,-(int)piVar5[2],(int)paiVar11);
    write_buffer_8x8(in,(int32_t *)((long)piVar6 + lVar10));
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_16x8_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[32], out[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  int bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    load_buffer_8x8(input + i * 8, in, stride, ud_flip, 0, shift[0]);
    col_txfm(in, in, bit, 2);
    col_txfm_8x8_rounding(in, -shift[1]);
    transpose_8x8(in, out + i * 16);
  }

  if (lr_flip) {
    flip_buf_sse4_1(in, out, 32);
    row_txfm(in, out, bit, 2);
  } else {
    row_txfm(out, out, bit, 2);
  }

  for (int i = 0; i < 2; i++) {
    av1_round_shift_rect_array_32_sse4_1(out + i * 16, in, 16, -shift[2],
                                         NewSqrt2);
    write_buffer_8x8(in, coeff + i * 64);
  }
  (void)bd;
}